

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O1

void __thiscall
ExchangeExternalFixups_ExternalEmpty_Test::~ExchangeExternalFixups_ExternalEmpty_Test
          (ExchangeExternalFixups_ExternalEmpty_Test *this)

{
  (this->super_ExchangeExternalFixups).super_Test._vptr_Test =
       (_func_int **)&PTR__ExchangeExternalFixups_002413e0;
  pstore::database::~database(&(this->super_ExchangeExternalFixups).import_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeExternalFixups).import_store_);
  pstore::database::~database(&(this->super_ExchangeExternalFixups).export_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeExternalFixups).export_store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (ExchangeExternalFixups, ExternalEmpty) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    // Start with an empty collection of external fixups.
    xfixup_collection xfixups;

    // Export the internal fixup array to the 'os' string-stream.
    export_ns::ostringstream os;
    export_ns::string_mapping names{export_db_, export_ns::name_index_tag ()};
    emit_external_fixups (os, export_ns::indent{}, export_db_, names, std::begin (xfixups),
                          std::end (xfixups), comments);

    // Setup the parse.
    xfixup_collection imported_xfixups;
    import_ns::string_mapping imported_names;
    auto parser = pstore::json::make_parser (import_ns::callbacks::make<xfixup_array_root> (
        &import_db_, &imported_names, &imported_xfixups));

    // Import the data that we just exported.
    parser.input (os.str ());
    parser.eof ();

    // Check the result.
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();
    EXPECT_THAT (imported_xfixups, testing::ContainerEq (xfixups))
        << "The imported and exported xfixups should match";
}